

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

CatalogEntry * __thiscall
duckdb::Catalog::GetEntry
          (Catalog *this,ClientContext *context,CatalogType catalog_type,string *schema_name,
          string *name)

{
  EntryLookupInfo lookup_info;
  optional_ptr<duckdb::CatalogEntry,_true> local_48;
  EntryLookupInfo local_40;
  
  EntryLookupInfo::EntryLookupInfo
            (&local_40,catalog_type,name,(QueryErrorContext)0xffffffffffffffff);
  local_48 = GetEntry(this,context,schema_name,&local_40,THROW_EXCEPTION);
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_48);
  return local_48.ptr;
}

Assistant:

CatalogEntry &Catalog::GetEntry(ClientContext &context, CatalogType catalog_type, const string &schema_name,
                                const string &name) {
	EntryLookupInfo lookup_info(catalog_type, name);
	return GetEntry(context, schema_name, lookup_info);
}